

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O0

void stbir__decode_float_linear_BGRA(float *decodep,int width_times_channels,void *inputp)

{
  float *pfVar1;
  bool bVar2;
  __m128 of3;
  __m128 of2;
  __m128 of1;
  __m128 of0;
  float *end_input_m16;
  float *input;
  float *decode_end;
  float *decode;
  void *inputp_local;
  int width_times_channels_local;
  float *decodep_local;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  undefined4 local_28;
  undefined4 uStack_24;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  undefined4 local_18;
  undefined4 uStack_14;
  undefined4 uStack_10;
  undefined4 uStack_c;
  
  pfVar1 = decodep + width_times_channels;
  if (width_times_channels < 0x10) {
    end_input_m16 = (float *)inputp;
    for (decode_end = decodep + 4; decode_end <= pfVar1; decode_end = decode_end + 4) {
      decode_end[-4] = end_input_m16[2];
      decode_end[-3] = end_input_m16[1];
      decode_end[-2] = *end_input_m16;
      decode_end[-1] = end_input_m16[3];
      end_input_m16 = end_input_m16 + 4;
    }
  }
  else {
    end_input_m16 = (float *)inputp;
    decode_end = decodep;
    do {
      do {
        local_18 = (undefined4)*(undefined8 *)end_input_m16;
        uStack_14 = (undefined4)((ulong)*(undefined8 *)end_input_m16 >> 0x20);
        uStack_10 = (undefined4)*(undefined8 *)(end_input_m16 + 2);
        uStack_c = (undefined4)((ulong)*(undefined8 *)(end_input_m16 + 2) >> 0x20);
        local_28 = (undefined4)*(undefined8 *)(end_input_m16 + 4);
        uStack_24 = (undefined4)((ulong)*(undefined8 *)(end_input_m16 + 4) >> 0x20);
        uStack_20 = (undefined4)*(undefined8 *)(end_input_m16 + 6);
        uStack_1c = (undefined4)((ulong)*(undefined8 *)(end_input_m16 + 6) >> 0x20);
        local_38 = (undefined4)*(undefined8 *)(end_input_m16 + 8);
        uStack_34 = (undefined4)((ulong)*(undefined8 *)(end_input_m16 + 8) >> 0x20);
        uStack_30 = (undefined4)*(undefined8 *)(end_input_m16 + 10);
        uStack_2c = (undefined4)((ulong)*(undefined8 *)(end_input_m16 + 10) >> 0x20);
        local_48 = (undefined4)*(undefined8 *)(end_input_m16 + 0xc);
        uStack_44 = (undefined4)((ulong)*(undefined8 *)(end_input_m16 + 0xc) >> 0x20);
        uStack_40 = (undefined4)*(undefined8 *)(end_input_m16 + 0xe);
        uStack_3c = (undefined4)((ulong)*(undefined8 *)(end_input_m16 + 0xe) >> 0x20);
        *(ulong *)decode_end = CONCAT44(uStack_14,uStack_10);
        *(ulong *)(decode_end + 2) = CONCAT44(uStack_c,local_18);
        *(ulong *)(decode_end + 4) = CONCAT44(uStack_24,uStack_20);
        *(ulong *)(decode_end + 6) = CONCAT44(uStack_1c,local_28);
        *(ulong *)(decode_end + 8) = CONCAT44(uStack_34,uStack_30);
        *(ulong *)(decode_end + 10) = CONCAT44(uStack_2c,local_38);
        *(ulong *)(decode_end + 0xc) = CONCAT44(uStack_44,uStack_40);
        *(ulong *)(decode_end + 0xe) = CONCAT44(uStack_3c,local_48);
        decode_end = decode_end + 0x10;
        end_input_m16 = end_input_m16 + 0x10;
      } while (decode_end <= pfVar1 + -0x10);
      bVar2 = decode_end != pfVar1;
      end_input_m16 = (float *)((long)inputp + (long)width_times_channels * 4 + -0x40);
      decode_end = pfVar1 + -0x10;
    } while (bVar2);
  }
  return;
}

Assistant:

static void STBIR__CODER_NAME(stbir__decode_float_linear)( float * decodep, int width_times_channels, void const * inputp )
{
  #ifdef stbir__decode_swizzle
  float STBIR_STREAMOUT_PTR( * ) decode = decodep;
  float * decode_end = (float*) decode + width_times_channels;
  float const * input = (float const *)inputp;

  #ifdef STBIR_SIMD
  if ( width_times_channels >= 16 )
  {
    float const * end_input_m16 = input + width_times_channels - 16;
    decode_end -= 16;
    STBIR_NO_UNROLL_LOOP_START_INF_FOR
    for(;;)
    {
      STBIR_NO_UNROLL(decode);
      #ifdef stbir__decode_swizzle
      #ifdef STBIR_SIMD8
      {
        stbir__simdf8 of0,of1;
        stbir__simdf8_load( of0, input );
        stbir__simdf8_load( of1, input+8 );
        stbir__decode_simdf8_flip( of0 );
        stbir__decode_simdf8_flip( of1 );
        stbir__simdf8_store( decode, of0 );
        stbir__simdf8_store( decode+8, of1 );
      }
      #else
      {
        stbir__simdf of0,of1,of2,of3;
        stbir__simdf_load( of0, input );
        stbir__simdf_load( of1, input+4 );
        stbir__simdf_load( of2, input+8 );
        stbir__simdf_load( of3, input+12 );
        stbir__decode_simdf4_flip( of0 );
        stbir__decode_simdf4_flip( of1 );
        stbir__decode_simdf4_flip( of2 );
        stbir__decode_simdf4_flip( of3 );
        stbir__simdf_store( decode, of0 );
        stbir__simdf_store( decode+4, of1 );
        stbir__simdf_store( decode+8, of2 );
        stbir__simdf_store( decode+12, of3 );
      }
      #endif
      #endif
      decode += 16;
      input += 16;
      if ( decode <= decode_end )
        continue;
      if ( decode == ( decode_end + 16 ) )
        break;
      decode = decode_end; // backup and do last couple
      input = end_input_m16;
    }
    return;
  }
  #endif

  // try to do blocks of 4 when you can
  #if stbir__coder_min_num != 3 // doesn't divide cleanly by four
  decode += 4;
  STBIR_SIMD_NO_UNROLL_LOOP_START
  while( decode <= decode_end )
  {
    STBIR_SIMD_NO_UNROLL(decode);
    decode[0-4] = input[stbir__decode_order0];
    decode[1-4] = input[stbir__decode_order1];
    decode[2-4] = input[stbir__decode_order2];
    decode[3-4] = input[stbir__decode_order3];
    decode += 4;
    input += 4;
  }
  decode -= 4;
  #endif

  // do the remnants
  #if stbir__coder_min_num < 4
  STBIR_NO_UNROLL_LOOP_START
  while( decode < decode_end )
  {
    STBIR_NO_UNROLL(decode);
    decode[0] = input[stbir__decode_order0];
    #if stbir__coder_min_num >= 2
    decode[1] = input[stbir__decode_order1];
    #endif
    #if stbir__coder_min_num >= 3
    decode[2] = input[stbir__decode_order2];
    #endif
    decode += stbir__coder_min_num;
    input += stbir__coder_min_num;
  }
  #endif

  #else

  if ( (void*)decodep != inputp )
    STBIR_MEMCPY( decodep, inputp, width_times_channels * sizeof( float ) );

  #endif
}